

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolve.cpp
# Opt level: O0

HighsStatus
solveUnconstrainedLp
          (HighsOptions *options,HighsLp *lp,HighsModelStatus *model_status,HighsInfo *highs_info,
          HighsSolution *solution,HighsBasis *basis)

{
  value_type vVar1;
  bool bVar2;
  HighsInt HVar3;
  const_reference pvVar4;
  double *pdVar5;
  reference pvVar6;
  reference pvVar7;
  HighsInfo *in_RCX;
  HighsModelStatus *in_RDX;
  uint *in_RSI;
  long in_RDI;
  undefined1 *in_R8;
  undefined1 *in_R9;
  double dVar8;
  HighsBasisStatus status;
  double dual_infeasibility;
  double primal_infeasibility_1;
  double value;
  double upper_1;
  double lower_1;
  double dual;
  double cost;
  HighsInt iCol;
  double upper;
  double lower;
  double primal_infeasibility;
  HighsInt iRow;
  double objective;
  double dual_feasibility_tolerance;
  double primal_feasibility_tolerance;
  HighsSparseMatrix *in_stack_fffffffffffffee8;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *in_stack_fffffffffffffef0;
  double local_f8;
  double local_f0;
  double local_e8;
  value_type local_d9;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  int local_a0;
  undefined1 local_99;
  undefined8 local_98;
  undefined8 local_90;
  double local_88;
  double local_80;
  double local_78;
  int local_6c;
  double local_68;
  double local_60;
  double local_58;
  undefined1 local_49;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  HighsInfo *local_28;
  HighsModelStatus *local_20;
  uint *local_18;
  long local_10;
  HighsStatus local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  resetModelStatusAndHighsInfo(in_RDX,in_RCX);
  if (((int)local_18[1] < 1) ||
     (HVar3 = HighsSparseMatrix::numNz(in_stack_fffffffffffffee8), HVar3 < 1)) {
    highsLogUser((HighsLogOptions *)(local_10 + 0x380),kInfo,
                 "Solving an unconstrained LP with %d columns\n",(ulong)*local_18);
    local_40 = 0;
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0,
               (size_type)in_stack_fffffffffffffee8,(value_type_conflict1 *)0x52cfc1);
    local_48 = 0;
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0,
               (size_type)in_stack_fffffffffffffee8,(value_type_conflict1 *)0x52cff1);
    local_49 = 4;
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::assign
              (in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8,(value_type *)0x52d01d
              );
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x52d02e);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x52d03f);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::clear
              ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)0x52d050);
    local_58 = *(double *)(local_10 + 0x118);
    local_60 = *(double *)(local_10 + 0x120);
    local_68 = *(double *)(local_18 + 0x3e);
    (local_28->super_HighsInfoStruct).num_primal_infeasibilities = 0;
    (local_28->super_HighsInfoStruct).max_primal_infeasibility = 0.0;
    (local_28->super_HighsInfoStruct).sum_primal_infeasibilities = 0.0;
    (local_28->super_HighsInfoStruct).num_dual_infeasibilities = 0;
    (local_28->super_HighsInfoStruct).max_dual_infeasibility = 0.0;
    (local_28->super_HighsInfoStruct).sum_dual_infeasibilities = 0.0;
    if (0 < (int)local_18[1]) {
      for (local_6c = 0; local_6c < (int)local_18[1]; local_6c = local_6c + 1) {
        local_78 = 0.0;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x14),
                            (long)local_6c);
        local_80 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x1a),
                            (long)local_6c);
        local_88 = *pvVar4;
        if (local_80 <= local_58) {
          if (local_88 < -local_58) {
            local_78 = -local_88;
          }
        }
        else {
          local_78 = local_80;
        }
        local_90 = 0;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0,
                   (value_type_conflict1 *)in_stack_fffffffffffffee8);
        local_98 = 0;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0,
                   (value_type_conflict1 *)in_stack_fffffffffffffee8);
        local_99 = 1;
        std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::push_back
                  (in_stack_fffffffffffffef0,(value_type *)in_stack_fffffffffffffee8);
        if (local_58 < local_78) {
          (local_28->super_HighsInfoStruct).num_primal_infeasibilities =
               (local_28->super_HighsInfoStruct).num_primal_infeasibilities + 1;
        }
        (local_28->super_HighsInfoStruct).sum_primal_infeasibilities =
             local_78 + (local_28->super_HighsInfoStruct).sum_primal_infeasibilities;
        pdVar5 = std::max<double>(&local_78,
                                  &(local_28->super_HighsInfoStruct).max_primal_infeasibility);
        (local_28->super_HighsInfoStruct).max_primal_infeasibility = *pdVar5;
      }
    }
    for (local_a0 = 0; local_a0 < (int)*local_18; local_a0 = local_a0 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 2),(long)local_a0);
      local_a8 = *pvVar4;
      local_b0 = (double)(int)local_18[0x3c] * local_a8;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 8),(long)local_a0);
      local_b8 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0xe),(long)local_a0
                         );
      local_c0 = *pvVar4;
      local_d0 = 0.0;
      local_d8 = -1.0;
      local_d9 = 4;
      if (local_b8 <= local_c0) {
        bVar2 = highs_isInfinity(-local_b8);
        if ((bVar2) && (bVar2 = highs_isInfinity(local_c0), bVar2)) {
          local_c8 = 0.0;
          local_d9 = kZero;
          local_d8 = ABS(local_b0);
        }
        else if (local_b0 < local_60) {
          if (-local_60 < local_b0) {
            bVar2 = highs_isInfinity(-local_b8);
            if (bVar2) {
              local_c8 = local_c0;
              local_d9 = kUpper;
            }
            else {
              local_c8 = local_b8;
              local_d9 = kLower;
            }
            local_d8 = ABS(local_b0);
          }
          else {
            bVar2 = highs_isInfinity(local_c0);
            if (bVar2) {
              local_c8 = local_b8;
              local_d9 = kLower;
              local_d8 = -local_b0;
            }
            else {
              local_c8 = local_c0;
              local_d9 = kUpper;
              local_d8 = 0.0;
            }
          }
        }
        else {
          bVar2 = highs_isInfinity(-local_b8);
          if (bVar2) {
            local_c8 = local_c0;
            local_d9 = kUpper;
            local_d8 = local_b0;
          }
          else {
            local_c8 = local_b8;
            local_d9 = kLower;
            local_d8 = 0.0;
          }
        }
      }
      else {
        bVar2 = highs_isInfinity(local_b8);
        if (bVar2) {
          bVar2 = highs_isInfinity(-local_c0);
          if (bVar2) {
            local_c8 = 0.0;
            local_d9 = kZero;
            local_d0 = INFINITY;
            local_d8 = ABS(local_b0);
          }
          else {
            local_c8 = local_c0;
            local_d9 = kUpper;
            local_d0 = local_b8 - local_c0;
            local_e8 = 0.0;
            pdVar5 = std::max<double>(&local_b0,&local_e8);
            local_d8 = *pdVar5;
          }
        }
        else {
          local_c8 = local_b8;
          local_d9 = kLower;
          local_d0 = local_b8 - local_c0;
          local_f0 = -local_b0;
          local_f8 = 0.0;
          pdVar5 = std::max<double>(&local_f0,&local_f8);
          local_d8 = *pdVar5;
        }
      }
      dVar8 = local_c8;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_30 + 8),(long)local_a0);
      *pvVar6 = dVar8;
      dVar8 = (double)(int)local_18[0x3c] * local_b0;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_30 + 0x20),
                          (long)local_a0);
      vVar1 = local_d9;
      *pvVar6 = dVar8;
      pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (local_38 + 0x30),(long)local_a0);
      *pvVar7 = vVar1;
      local_68 = local_c8 * local_a8 + local_68;
      if (local_58 < local_d0) {
        (local_28->super_HighsInfoStruct).num_primal_infeasibilities =
             (local_28->super_HighsInfoStruct).num_primal_infeasibilities + 1;
      }
      (local_28->super_HighsInfoStruct).sum_primal_infeasibilities =
           local_d0 + (local_28->super_HighsInfoStruct).sum_primal_infeasibilities;
      pdVar5 = std::max<double>(&local_d0,
                                &(local_28->super_HighsInfoStruct).max_primal_infeasibility);
      (local_28->super_HighsInfoStruct).max_primal_infeasibility = *pdVar5;
      if (local_60 < local_d8) {
        (local_28->super_HighsInfoStruct).num_dual_infeasibilities =
             (local_28->super_HighsInfoStruct).num_dual_infeasibilities + 1;
      }
      (local_28->super_HighsInfoStruct).sum_dual_infeasibilities =
           local_d8 + (local_28->super_HighsInfoStruct).sum_dual_infeasibilities;
      pdVar5 = std::max<double>(&local_d8,&(local_28->super_HighsInfoStruct).max_dual_infeasibility)
      ;
      (local_28->super_HighsInfoStruct).max_dual_infeasibility = *pdVar5;
    }
    (local_28->super_HighsInfoStruct).objective_function_value = local_68;
    *local_30 = 1;
    local_30[1] = 1;
    *local_38 = 1;
    local_38[2] = 1;
    (local_28->super_HighsInfoStruct).basis_validity = 1;
    setSolutionStatus(local_28);
    if ((local_28->super_HighsInfoStruct).num_primal_infeasibilities == 0) {
      if ((local_28->super_HighsInfoStruct).num_dual_infeasibilities == 0) {
        *local_20 = kOptimal;
      }
      else {
        *local_20 = kUnbounded;
      }
    }
    else {
      *local_20 = kInfeasible;
    }
    local_4 = kOk;
  }
  else {
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus solveUnconstrainedLp(const HighsOptions& options, const HighsLp& lp,
                                 HighsModelStatus& model_status,
                                 HighsInfo& highs_info, HighsSolution& solution,
                                 HighsBasis& basis) {
  // Aliase to model status and solution parameters
  resetModelStatusAndHighsInfo(model_status, highs_info);

  // Check that the LP really is unconstrained!
  assert(lp.num_row_ == 0 || lp.a_matrix_.numNz() == 0);
  if (lp.num_row_ > 0) {
    // LP has rows, but should only be here if the constraint matrix
    // is zero
    if (lp.a_matrix_.numNz() > 0) return HighsStatus::kError;
  }

  highsLogUser(options.log_options, HighsLogType::kInfo,
               "Solving an unconstrained LP with %" HIGHSINT_FORMAT
               " columns\n",
               lp.num_col_);
  solution.col_value.assign(lp.num_col_, 0);
  solution.col_dual.assign(lp.num_col_, 0);
  basis.col_status.assign(lp.num_col_, HighsBasisStatus::kNonbasic);
  // No rows for primal solution, dual solution or basis
  solution.row_value.clear();
  solution.row_dual.clear();
  basis.row_status.clear();

  double primal_feasibility_tolerance = options.primal_feasibility_tolerance;
  double dual_feasibility_tolerance = options.dual_feasibility_tolerance;

  // Initialise the objective value calculation. Done using
  // HighsSolution so offset is vanilla
  double objective = lp.offset_;

  highs_info.num_primal_infeasibilities = 0;
  highs_info.max_primal_infeasibility = 0;
  highs_info.sum_primal_infeasibilities = 0;
  highs_info.num_dual_infeasibilities = 0;
  highs_info.max_dual_infeasibility = 0;
  highs_info.sum_dual_infeasibilities = 0;

  if (lp.num_row_ > 0) {
    // Assign primal, dual and basis status for rows, checking for
    // infeasibility
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
      double primal_infeasibility = 0;
      double lower = lp.row_lower_[iRow];
      double upper = lp.row_upper_[iRow];
      if (lower > primal_feasibility_tolerance) {
        // Lower bound too large for zero activity
        primal_infeasibility = lower;
      } else if (upper < -primal_feasibility_tolerance) {
        // Upper bound too small for zero activity
        primal_infeasibility = -upper;
      }
      solution.row_value.push_back(0);
      solution.row_dual.push_back(0);
      basis.row_status.push_back(HighsBasisStatus::kBasic);
      if (primal_infeasibility > primal_feasibility_tolerance)
        highs_info.num_primal_infeasibilities++;
      highs_info.sum_primal_infeasibilities += primal_infeasibility;
      highs_info.max_primal_infeasibility =
          std::max(primal_infeasibility, highs_info.max_primal_infeasibility);
    }
  }

  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double cost = lp.col_cost_[iCol];
    double dual = (HighsInt)lp.sense_ * cost;
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    double value;
    double primal_infeasibility = 0;
    double dual_infeasibility = -1;
    HighsBasisStatus status = HighsBasisStatus::kNonbasic;
    if (lower > upper) {
      // Inconsistent bounds, so set the variable to lower bound,
      // unless it's infinite. Otherwise set the variable to upper
      // bound, unless it's infinite. Otherwise set the variable to
      // zero.
      if (highs_isInfinity(lower)) {
        // Lower bound of +inf
        if (highs_isInfinity(-upper)) {
          // Upper bound of -inf
          value = 0;
          status = HighsBasisStatus::kZero;
          primal_infeasibility = kHighsInf;
          dual_infeasibility = std::fabs(dual);
        } else {
          // Finite upper bound - since lower exceeds it
          value = upper;
          status = HighsBasisStatus::kUpper;
          primal_infeasibility = lower - value;
          dual_infeasibility = std::max(dual, 0.);
        }
      } else {
        // Finite lower bound
        value = lower;
        status = HighsBasisStatus::kLower;
        primal_infeasibility = value - upper;
        dual_infeasibility = std::max(-dual, 0.);
      }
    } else if (highs_isInfinity(-lower) && highs_isInfinity(upper)) {
      // Free column: set to zero and record dual infeasibility
      value = 0;
      status = HighsBasisStatus::kZero;
      dual_infeasibility = std::fabs(dual);
    } else if (dual >= dual_feasibility_tolerance) {
      // Column with sufficiently positive dual
      if (!highs_isInfinity(-lower)) {
        // Set to this finite lower bound
        value = lower;
        status = HighsBasisStatus::kLower;
        dual_infeasibility = 0;
      } else {
        // Infinite lower bound so set to upper bound and record dual
        // infeasibility
        value = upper;
        status = HighsBasisStatus::kUpper;
        dual_infeasibility = dual;
      }
    } else if (dual <= -dual_feasibility_tolerance) {
      // Column with sufficiently negative dual
      if (!highs_isInfinity(upper)) {
        // Set to this finite upper bound
        value = upper;
        status = HighsBasisStatus::kUpper;
        dual_infeasibility = 0;
      } else {
        // Infinite upper bound so set to lower bound and record dual
        // infeasibility
        value = lower;
        status = HighsBasisStatus::kLower;
        dual_infeasibility = -dual;
      }
    } else {
      // Column with sufficiently small dual: set to lower bound (if
      // finite) otherwise upper bound
      if (highs_isInfinity(-lower)) {
        value = upper;
        status = HighsBasisStatus::kUpper;
      } else {
        value = lower;
        status = HighsBasisStatus::kLower;
      }
      dual_infeasibility = std::fabs(dual);
    }
    assert(status != HighsBasisStatus::kNonbasic);
    assert(dual_infeasibility >= 0);
    solution.col_value[iCol] = value;
    solution.col_dual[iCol] = (HighsInt)lp.sense_ * dual;
    basis.col_status[iCol] = status;
    objective += value * cost;
    if (primal_infeasibility > primal_feasibility_tolerance)
      highs_info.num_primal_infeasibilities++;
    highs_info.sum_primal_infeasibilities += primal_infeasibility;
    highs_info.max_primal_infeasibility =
        std::max(primal_infeasibility, highs_info.max_primal_infeasibility);
    if (dual_infeasibility > dual_feasibility_tolerance)
      highs_info.num_dual_infeasibilities++;
    highs_info.sum_dual_infeasibilities += dual_infeasibility;
    highs_info.max_dual_infeasibility =
        std::max(dual_infeasibility, highs_info.max_dual_infeasibility);
  }
  highs_info.objective_function_value = objective;
  solution.value_valid = true;
  solution.dual_valid = true;
  basis.valid = true;
  basis.useful = true;
  highs_info.basis_validity = kBasisValidityValid;
  setSolutionStatus(highs_info);
  if (highs_info.num_primal_infeasibilities) {
    // Primal infeasible
    model_status = HighsModelStatus::kInfeasible;
  } else if (highs_info.num_dual_infeasibilities) {
    // Dual infeasible => primal unbounded for unconstrained LP
    model_status = HighsModelStatus::kUnbounded;
  } else {
    model_status = HighsModelStatus::kOptimal;
  }

  return HighsStatus::kOk;
}